

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall cmake::Generate(cmake *this)

{
  bool bVar1;
  WorkingMode WVar2;
  ulong uVar3;
  ostream *poVar4;
  char *pcVar5;
  allocator local_39;
  string local_38;
  cmake *local_18;
  cmake *this_local;
  
  if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
    this_local._4_4_ = -1;
  }
  else {
    local_18 = this;
    bVar1 = cmGlobalGenerator::Compute(this->GlobalGenerator);
    if (bVar1) {
      (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0xb])();
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        poVar4 = std::operator<<((ostream *)&std::cout,"Generate graphviz: ");
        poVar4 = std::operator<<(poVar4,(string *)&this->GraphVizFile);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        GenerateGraphViz(this,pcVar5);
      }
      if ((this->WarnUnusedCli & 1U) != 0) {
        RunCheckForUnusedVariables(this);
      }
      bVar1 = cmSystemTools::GetErrorOccuredFlag();
      if (bVar1) {
        this_local._4_4_ = -1;
      }
      else {
        WVar2 = GetWorkingMode(this);
        if (WVar2 == NORMAL_MODE) {
          pcVar5 = GetHomeOutputDirectory(this);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_38,pcVar5,&local_39);
          SaveCache(this,&local_38);
          std::__cxx11::string::~string((string *)&local_38);
          std::allocator<char>::~allocator((allocator<char> *)&local_39);
        }
        this_local._4_4_ = 0;
      }
    }
    else {
      this_local._4_4_ = -1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int cmake::Generate()
{
  if (!this->GlobalGenerator) {
    return -1;
  }
  if (!this->GlobalGenerator->Compute()) {
    return -1;
  }
  this->GlobalGenerator->Generate();
  if (!this->GraphVizFile.empty()) {
    std::cout << "Generate graphviz: " << this->GraphVizFile << std::endl;
    this->GenerateGraphViz(this->GraphVizFile.c_str());
  }
  if (this->WarnUnusedCli) {
    this->RunCheckForUnusedVariables();
  }
  if (cmSystemTools::GetErrorOccuredFlag()) {
    return -1;
  }
  // Save the cache again after a successful Generate so that any internal
  // variables created during Generate are saved. (Specifically target GUIDs
  // for the Visual Studio and Xcode generators.)
  if (this->GetWorkingMode() == NORMAL_MODE) {
    this->SaveCache(this->GetHomeOutputDirectory());
  }
  return 0;
}